

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Radio_Communications_Header.cpp
# Opt level: O2

KDataStream * __thiscall
KDIS::PDU::Radio_Communications_Header::Encode
          (KDataStream *__return_storage_ptr__,Radio_Communications_Header *this)

{
  KDataStream::KDataStream(__return_storage_ptr__,Big_Endian);
  Encode(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

KDataStream Radio_Communications_Header::Encode() const
{
    KDataStream stream;

    Radio_Communications_Header::Encode( stream );

    return stream;
}